

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O1

void __thiscall Excel::Stream::read<char>(Stream *this,char *retVal,int32_t bytes)

{
  uint uVar1;
  int iVar2;
  Exception *this_00;
  int iVar3;
  int iVar4;
  int iVar5;
  wstring local_50;
  
  *retVal = '\0';
  iVar3 = bytes + (uint)(bytes == 0);
  if (0 < iVar3) {
    iVar5 = 0;
    iVar4 = iVar3;
    do {
      iVar4 = iVar4 + -1;
      uVar1 = (*this->_vptr_Stream[2])(this);
      iVar2 = (*this->_vptr_Stream[3])(this);
      if ((char)iVar2 != '\0') {
        this_00 = (Exception *)__cxa_allocate_exception(0x30);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_50,L"Unexpected end of file.",L"");
        Exception::Exception(this_00,&local_50);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      iVar2 = iVar5;
      if (this->m_byteOrder != (uint)(*SystemByteOrder::byteOrder()::byte != '\0')) {
        iVar2 = iVar4;
      }
      *retVal = *retVal | (byte)((uVar1 & 0xff) << ((byte)(iVar2 << 3) & 0x1f));
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar3);
  }
  return;
}

Assistant:

void read( Type & retVal, int32_t bytes = 0 )
	{
		retVal = Type(0);
		if( bytes == 0 ) bytes = sizeof( Type );

		for( int32_t i = 0; i < bytes; ++i )
		{
			Type c = (Type)(unsigned char) getByte();

			if( eof() )
				throw Exception( L"Unexpected end of file." );

			if( SystemByteOrder::byteOrder() != m_byteOrder )
				retVal |= ( c << 8 * ( bytes - i - 1 ) );
			else
				retVal |= ( c << 8 * i );
		}
	}